

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O2

string * Hpipe::anon_unknown_21::left_shifted(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  istream *piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *__lhs;
  ulong uVar6;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream ss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)str,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  uVar6 = 1000000;
  while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&ss,(string *)&line),
        ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    uVar3 = std::__cxx11::string::find_first_not_of((char)&line,0x20);
    uVar5 = uVar6;
    if (uVar3 < uVar6) {
      uVar5 = uVar3;
    }
    if (uVar3 != 0xffffffffffffffff) {
      uVar6 = uVar5;
    }
  }
  if (uVar6 == 1000000) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::ios::clear((int)(istringstream *)&ss + (int)*(undefined8 *)(_ss + -0x18));
    std::istream::seekg(&ss,0,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&ss,(string *)&line),
          ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      lVar4 = std::__cxx11::string::find_first_not_of((char)&line,0x20);
      if (lVar4 != -1) {
        sVar1 = __return_storage_ptr__->_M_string_length;
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
        __lhs = "\n";
        if (sVar1 == 0) {
          __lhs = "";
        }
        std::operator+(&local_1d0,__lhs,&local_1f0);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string left_shifted( const std::string &str ) {
    std::string::size_type min_pos = 1e6;
    std::istringstream ss( str );
    std::string line;
    while( std::getline( ss, line ) ) {
        auto pos = line.find_first_not_of( ' ' );
        if ( pos != std::string::npos )
            min_pos = std::min( min_pos, pos );
    }
    if ( min_pos == 1e6 )
        return str;

    ss.clear();
    ss.seekg( 0 );
    std::string res;
    while( std::getline( ss, line ) ) {
        if ( line.find_first_not_of( ' ' ) != std::string::npos )
            res += ( res.size() ? "\n" : "" ) + line.substr( min_pos );
    }
    return res;
}